

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<unsigned_long,int>
          (string *__return_storage_ptr__,internal *this,unsigned_long *value,int *param_2)

{
  int *param_1_local;
  unsigned_long *value_local;
  
  PrintToString<unsigned_long>(__return_storage_ptr__,(unsigned_long *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}